

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

_Bool spell_cast(wchar_t spell_index,wchar_t dir,command_conflict *cmd)

{
  short sVar1;
  int iVar2;
  effect *effect;
  _Bool _Var3;
  int16_t iVar4;
  wchar_t beam_00;
  wchar_t wVar5;
  class_spell_conflict *pcVar6;
  source sVar7;
  source origin;
  wchar_t oops;
  wchar_t e;
  class_spell_conflict *spell;
  _Bool local_2d;
  wchar_t beam;
  _Bool ident;
  command_conflict *pcStack_28;
  wchar_t chance;
  command_conflict *cmd_local;
  wchar_t local_18;
  wchar_t dir_local;
  wchar_t spell_index_local;
  
  local_2d = false;
  pcStack_28 = cmd;
  cmd_local._4_4_ = dir;
  local_18 = spell_index;
  beam_00 = beam_chance();
  pcVar6 = spell_by_index(player,local_18);
  iVar4 = spell_chance(local_18);
  beam = (wchar_t)iVar4;
  wVar5 = Rand_div(100);
  if (wVar5 < beam) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("You failed to concentrate hard enough!");
  }
  else {
    effect = pcVar6->effect;
    sVar7 = source_player();
    origin.which = sVar7.which;
    origin._4_4_ = 0;
    origin.what = sVar7.what;
    _Var3 = effect_do(effect,origin,(object *)0x0,&local_2d,true,cmd_local._4_4_,beam_00,L'\0',
                      pcStack_28);
    if (!_Var3) {
      return false;
    }
    _Var3 = flag_has_dbg((player->state).pflags,3,0x11,"player->state.pflags","(PF_COMBAT_REGEN)");
    if (_Var3) {
      convert_mana_to_hp(player,pcVar6->smana << 0x10);
    }
    sound(0x92);
    if ((player->spell_flags[local_18] & 2) == 0) {
      iVar2 = pcVar6->sexp;
      player->spell_flags[local_18] = player->spell_flags[local_18] | 2;
      player_exp_gain(player,iVar2 * pcVar6->slevel);
      player->upkeep->redraw = player->upkeep->redraw | 0x200000;
    }
  }
  if ((int)player->csp < pcVar6->smana) {
    iVar2 = pcVar6->smana;
    sVar1 = player->csp;
    player->csp = 0;
    player->csp_frac = 0;
    player_over_exert(player,L'\x02',L'd',(iVar2 - sVar1) * 5 + L'\x01');
    player_over_exert(player,L'\x01',L'2',L'\0');
  }
  else {
    player->csp = player->csp - (short)pcVar6->smana;
  }
  player->upkeep->redraw = player->upkeep->redraw | 0x80;
  return true;
}

Assistant:

bool spell_cast(int spell_index, int dir, struct command *cmd)
{
	int chance;
	bool ident = false;
	int beam  = beam_chance();

	/* Get the spell */
	const struct class_spell *spell = spell_by_index(player, spell_index);

	/* Spell failure chance */
	chance = spell_chance(spell_index);

	/* Fail or succeed */
	if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to concentrate hard enough!");
	} else {
		/* Cast the spell */
		if (!effect_do(spell->effect, source_player(), NULL, &ident, true, dir,
					   beam, 0, cmd)) {
			return false;
		}

		/* Reward COMBAT_REGEN with small HP recovery */
		if (player_has(player, PF_COMBAT_REGEN)) {
			convert_mana_to_hp(player, spell->smana << 16);
		}

		/* A spell was cast */
		sound(MSG_SPELL);

		if (!(player->spell_flags[spell_index] & PY_SPELL_WORKED)) {
			int e = spell->sexp;

			/* The spell worked */
			player->spell_flags[spell_index] |= PY_SPELL_WORKED;

			/* Gain experience */
			player_exp_gain(player, e * spell->slevel);

			/* Redraw object recall */
			player->upkeep->redraw |= (PR_OBJECT);
		}
	}

	/* Sufficient mana? */
	if (spell->smana <= player->csp) {
		/* Use some mana */
		player->csp -= spell->smana;
	} else {
		int oops = spell->smana - player->csp;

		/* No mana left */
		player->csp = 0;
		player->csp_frac = 0;

		/* Over-exert the player */
		player_over_exert(player, PY_EXERT_FAINT, 100, 5 * oops + 1);
		player_over_exert(player, PY_EXERT_CON, 50, 0);
	}

	/* Redraw mana */
	player->upkeep->redraw |= (PR_MANA);

	return true;
}